

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::CodedStreamTest_Trim_Test::~CodedStreamTest_Trim_Test
          (CodedStreamTest_Trim_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(CodedStreamTest, Trim) {
  CordOutputStream cord_output;
  CodedOutputStream coded_output(&cord_output);

  // Verify that any initially reserved output buffers created when the output
  // streams were created are trimmed on an initial Trim call.
  coded_output.Trim();
  EXPECT_EQ(0, coded_output.ByteCount());

  // Write a single byte to the coded stream, ensure the cord stream has been
  // advanced, and then verify Trim() does the right thing.
  const char kTestData[] = "abcdef";
  coded_output.WriteRaw(kTestData, 1);
  coded_output.Trim();
  EXPECT_EQ(1, coded_output.ByteCount());

  // Write some more data to the coded stream, Trim() it, and verify
  // everything behaves as expected.
  coded_output.WriteRaw(kTestData, sizeof(kTestData));
  coded_output.Trim();
  EXPECT_EQ(1 + sizeof(kTestData), coded_output.ByteCount());

  absl::Cord cord = cord_output.Consume();
  EXPECT_EQ(1 + sizeof(kTestData), cord.size());
}